

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  size_t sVar1;
  wchar_t *local_40;
  size_t local_38;
  wchar_t local_30 [4];
  
  if (str != (wchar_t *)0x0) {
    local_40 = local_30;
    sVar1 = wcslen(str);
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_40,str,str + sVar1);
    PrintCharsAsStringTo<wchar_t>(local_40,local_38,os);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::wstring(str), os);
    }
  }